

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::ClassStatement(SQCompiler *this)

{
  SQInteger SVar1;
  SQInteger SVar2;
  bool bVar3;
  undefined7 uVar4;
  SQExpState es;
  SQCompiler *this_local;
  
  Lex(this);
  SVar1 = (this->_es).etype;
  SVar2 = (this->_es).epos;
  bVar3 = (this->_es).donot_get;
  uVar4 = *(undefined7 *)&(this->_es).field_0x11;
  (this->_es).donot_get = true;
  PrefixedExpr(this);
  if ((this->_es).etype == 1) {
    Error(this,"invalid class name");
  }
  else if (((this->_es).etype == 2) || ((this->_es).etype == 3)) {
    ClassExp(this);
    EmitDerefOp(this,_OP_NEWSLOT);
    SQFuncState::PopTarget(this->_fs);
  }
  else {
    Error(this,"cannot create a class in a local with the syntax(class <local>)");
  }
  (this->_es).etype = SVar1;
  (this->_es).epos = SVar2;
  (this->_es).donot_get = bVar3;
  *(undefined7 *)&(this->_es).field_0x11 = uVar4;
  return;
}

Assistant:

void ClassStatement()
    {
        SQExpState es;
        Lex();
        es = _es;
        _es.donot_get = true;
        PrefixedExpr();
        if(_es.etype == EXPR) {
            Error(_SC("invalid class name"));
        }
        else if(_es.etype == OBJECT || _es.etype == BASE) {
            ClassExp();
            EmitDerefOp(_OP_NEWSLOT);
            _fs->PopTarget();
        }
        else {
            Error(_SC("cannot create a class in a local with the syntax(class <local>)"));
        }
        _es = es;
    }